

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O3

BasicValue *
cvm::Native::Print(BasicValue *__return_storage_ptr__,
                  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_> local_68;
  BasicValue *local_58;
  string local_50;
  
  p_Var2 = (Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  local_58 = __return_storage_ptr__;
  if (p_Var2 != (_List_node_base *)Args) {
    do {
      local_68.
      super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_68.
      super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      BasicValue::toString_abi_cxx11_(&local_50,(BasicValue *)(p_Var2 + 1),&local_68);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_68.
          super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.
                   super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      p_Var2 = (((_List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)&p_Var2->_M_next)
               ->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)Args);
  }
  local_58->Type = VoidType;
  (local_58->StrVal)._M_dataplus._M_p = (pointer)&(local_58->StrVal).field_2;
  (local_58->StrVal)._M_string_length = 0;
  (local_58->StrVal).field_2._M_local_buf[0] = '\0';
  (local_58->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (local_58->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return local_58;
}

Assistant:

BasicValue Native::Print(std::list<BasicValue> &Args) {
  for (auto &Arg : Args) {
    std::cout << Arg.toString() << " ";
  }
  return BasicValue();
}